

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakOutputStringBuffer::stopMemoryLeakReporting(MemoryLeakOutputStringBuffer *this)

{
  bool bVar1;
  bool buffer_reached_its_capacity;
  MemoryLeakOutputStringBuffer *this_local;
  
  if (this->total_leaks_ == 0) {
    addNoMemoryLeaksMessage(this);
  }
  else {
    bVar1 = SimpleStringBuffer::reachedItsCapacity(&this->outputBuffer_);
    SimpleStringBuffer::resetWriteLimit(&this->outputBuffer_);
    if (bVar1) {
      addErrorMessageForTooMuchLeaks(this);
    }
    addMemoryLeakFooter(this,this->total_leaks_);
    if ((this->giveWarningOnUsingMalloc_ & 1U) != 0) {
      addWarningForUsingMalloc(this);
    }
  }
  return;
}

Assistant:

void MemoryLeakOutputStringBuffer::stopMemoryLeakReporting()
{
    if (total_leaks_ == 0) {
        addNoMemoryLeaksMessage();
        return;
    }

    bool buffer_reached_its_capacity = outputBuffer_.reachedItsCapacity();
    outputBuffer_.resetWriteLimit();

    if (buffer_reached_its_capacity)
        addErrorMessageForTooMuchLeaks();

    addMemoryLeakFooter(total_leaks_);

    if (giveWarningOnUsingMalloc_)
        addWarningForUsingMalloc();

}